

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O2

char * curl_easy_escape(Curl_easy *data,char *string,int inlength)

{
  size_t sVar1;
  CURLcode CVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  uchar *mem;
  size_t sStack_60;
  uchar in;
  uchar local_53;
  char local_52;
  char local_51;
  dynbuf d;
  
  if (inlength < 0) {
    return (char *)0x0;
  }
  Curl_dyn_init(&d,24000000);
  if (inlength == 0) {
    sVar3 = strlen(string);
    if (sVar3 == 0) {
      pcVar4 = (*Curl_cstrdup)("");
      return pcVar4;
    }
  }
  else {
    sVar3 = (size_t)(uint)inlength;
  }
  sVar5 = 0;
  sVar1 = 1;
  while( true ) {
    if (sVar3 == sVar5) {
      pcVar4 = Curl_dyn_ptr(&d);
      return pcVar4;
    }
    in = string[sVar5];
    sStack_60 = sVar1;
    mem = &in;
    if ((((9 < (byte)(in - 0x30)) && (0x19 < (byte)((in & 0xdf) + 0xbf))) && (1 < in - 0x2d)) &&
       ((in != 0x7e && (in != 0x5f)))) {
      local_53 = '%';
      local_52 = "0123456789ABCDEF"[in >> 4];
      local_51 = "0123456789ABCDEF"[in & 0xf];
      sStack_60 = 3;
      mem = &local_53;
    }
    CVar2 = Curl_dyn_addn(&d,mem,sStack_60);
    if (CVar2 != CURLE_OK) break;
    sVar5 = sVar5 + 1;
  }
  return (char *)0x0;
}

Assistant:

char *curl_easy_escape(struct Curl_easy *data, const char *string,
                       int inlength)
{
  size_t length;
  struct dynbuf d;
  (void)data;

  if(inlength < 0)
    return NULL;

  Curl_dyn_init(&d, CURL_MAX_INPUT_LENGTH * 3);

  length = (inlength?(size_t)inlength:strlen(string));
  if(!length)
    return strdup("");

  while(length--) {
    unsigned char in = *string++; /* treat the characters unsigned */

    if(ISUNRESERVED(in)) {
      /* append this */
      if(Curl_dyn_addn(&d, &in, 1))
        return NULL;
    }
    else {
      /* encode it */
      const char hex[] = "0123456789ABCDEF";
      char out[3]={'%'};
      out[1] = hex[in>>4];
      out[2] = hex[in & 0xf];
      if(Curl_dyn_addn(&d, out, 3))
        return NULL;
    }
  }

  return Curl_dyn_ptr(&d);
}